

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_syntax.cpp
# Opt level: O2

ParserResult *
parse_variable_declaration
          (ParserResult *__return_storage_ptr__,ParserContext *parser,token_iterator begin,
          token_iterator end)

{
  Token TVar1;
  element_type *peVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  TokenData *pTVar5;
  bool bVar6;
  SyntaxTree *__p;
  __shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2> *p_Var7;
  SmallVector<ParserError,_1U> *elist;
  ParserSuccess *pPVar8;
  SyntaxTree *pSVar9;
  shared_ptr<SyntaxTree> *other;
  variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_> *variant;
  pair<const_TokenStream::TokenData_*,_eggs::variants::variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>_>
  *ppVar10;
  ParserResult *pPVar11;
  initializer_list<ParserError> IL;
  TokenData *it;
  token_iterator local_298;
  ParserResult *local_290;
  ulong local_288;
  token_iterator begin_local;
  __shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2> local_278;
  undefined1 local_268 [16];
  pair<const_TokenStream::TokenData_*,_eggs::variants::variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>_>
  rule_result;
  undefined1 local_1f8 [16];
  string local_1e8 [32];
  pair<const_TokenStream::TokenData_*,_eggs::variants::variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>_>
  local_1c8;
  ParserState idents;
  ParserError e;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_b0;
  undefined8 local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_a0;
  undefined8 local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_90;
  ParserState local_88;
  
  local_290 = __return_storage_ptr__;
  begin_local = begin;
  if ((begin == end) || (TVar1 = begin->type, 7 < TVar1 - VAR_INT)) {
    local_1c8.first = (TokenData *)((ulong)local_1c8.first & 0xffffffff00000000);
    make_error<ParserStatus,TokenStream::TokenData_const*&>
              ((ParserState *)&rule_result,(ParserStatus *)&local_1c8,&begin_local);
    pPVar11 = local_290;
    local_290->first = end;
    eggs::variants::detail::
    _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
    ::_storage((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                *)&local_290->second,
               (_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                *)&rule_result);
    ppVar10 = &rule_result;
    goto LAB_001bd916;
  }
  pSVar9 = (SyntaxTree *)(begin + 1);
  idents._storage.
  super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
  .
  super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
  .
  super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
  .field_0._64_8_ = 0;
  idents._storage.
  super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
  .
  super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
  .
  super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
  .field_0._72_8_ = 0;
  idents._storage.
  super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
  .
  super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
  .
  super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
  .field_0._48_8_ = 0;
  idents._storage.
  super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
  .
  super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
  .
  super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
  .field_0._56_8_ = 0;
  idents._storage.
  super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
  .
  super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
  .
  super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
  .field_0._32_8_ = 0;
  idents._storage.
  super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
  .
  super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
  .
  super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
  .field_0._40_8_ = 0;
  idents._storage.
  super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
  .
  super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
  .
  super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
  .field_0._16_8_ = 0;
  idents._storage.
  super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
  .
  super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
  .
  super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
  .field_0._24_8_ = 0;
  idents._storage.
  super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
  .
  super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
  .
  super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
  .field_0._0_8_ = 0;
  idents._storage.
  super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
  .
  super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
  .
  super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
  .field_0._8_8_ = 0;
  idents._storage.
  super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
  .
  super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
  ._which = 0;
  it = (TokenData *)pSVar9;
  local_298 = begin;
  __p = (SyntaxTree *)operator_new(0x88);
  (__p->parent_).super_OptionalBase<std::weak_ptr<SyntaxTree>_>.storage_.dummy_ = '\0';
  (__p->udata).vtable = (vtable_type *)0x0;
  (__p->instream).super___shared_ptr<SyntaxTree::InputStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__p->instream).super___shared_ptr<SyntaxTree::InputStream,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__p->childs).
  super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->childs).
  super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(__p->childs).
           super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(__p->childs).
           super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (__p->super_enable_shared_from_this<SyntaxTree>)._M_weak_this.
  super___weak_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (__p->super_enable_shared_from_this<SyntaxTree>)._M_weak_this.
  super___weak_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __p->type_ = Block;
  std::__shared_ptr<SyntaxTree,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<SyntaxTree,void>
            ((__shared_ptr<SyntaxTree,(__gnu_cxx::_Lock_policy)2> *)local_1f8,__p);
  local_288 = (ulong)(TVar1 - Label);
  e.state = GiveUp;
  e._4_4_ = 0;
  e.context = (token_iterator)0x0;
  rule_result.first = (TokenData *)0x0;
  rule_result.second._storage.
  super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
  .
  super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
  .
  super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
  .field_0._0_8_ = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&rule_result.second);
  while ((variant = &rule_result.second, pSVar9 != (SyntaxTree *)end &&
         (*(Token *)&(pSVar9->super_enable_shared_from_this<SyntaxTree>)._M_weak_this.
                     super___weak_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr != NewLine))) {
    parse_identifier(&rule_result,parser,(token_iterator)pSVar9,end);
    bVar6 = is<ParserSuccess,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>>
                      (variant);
    if (bVar6) {
      bVar6 = is<ParserSuccess,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>>
                        ((variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_> *)&e)
      ;
      uVar3 = local_1f8._0_8_;
      if (bVar6) {
        p_Var7 = (__shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2> *)
                 eggs::variants::
                 get<ParserSuccess,ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>,0ul>
                           (variant);
        std::__shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_278,p_Var7);
        SyntaxTree::add_child((SyntaxTree *)uVar3,(shared_ptr<SyntaxTree> *)&local_278);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_278._M_refcount);
      }
    }
    else {
      elist = eggs::variants::
              get<llvm_vecsmall::SmallVector<ParserError,1u>,ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>,1ul>
                        (variant);
      add_error((ParserState *)&e,elist);
    }
    pSVar9 = (SyntaxTree *)rule_result.first;
    eggs::variants::detail::
    _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
    ::~_storage(&rule_result.second._storage);
  }
  bVar6 = is<ParserSuccess,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>>
                    ((variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_> *)&e);
  uVar4 = local_1f8._8_8_;
  uVar3 = local_1f8._0_8_;
  local_1c8.first = (TokenData *)pSVar9;
  if (bVar6) {
    local_1f8._0_8_ = (SyntaxTree *)0x0;
    local_1f8._8_8_ = 0;
    _Stack_b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_a8 = 0;
    _Stack_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1c8.second._storage.
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
    .
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
    .
    super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
    .field_0._0_8_ = uVar3;
    local_1c8.second._storage.
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
    .
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
    .
    super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
    .field_0._8_8_ = uVar4;
    rule_result.second._storage.
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
    .
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
    .
    super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
    .field_0._0_8_ = 0;
    rule_result.second._storage.
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
    .
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
    .
    super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
    .field_0._8_8_ = 0;
    local_1c8.second._storage.
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
    .
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
    ._which = 1;
    rule_result.first = (TokenData *)pSVar9;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&rule_result.second._storage.
                       super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                       .
                       super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
                       .
                       super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
                       .field_0 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_a0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_b0);
  }
  else {
    eggs::variants::detail::
    _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
    ::_storage((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                *)&local_1c8.second,
               (_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                *)&e);
  }
  eggs::variants::detail::
  _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
  ::~_storage((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
               *)&e);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1f8 + 8));
  rule_result.first = (TokenData *)&idents;
  rule_result.second._storage.
  super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
  .
  super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
  .
  super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
  .field_0._0_8_ = &it;
  std::
  tuple<TokenStream::TokenData_const*&,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>&>
  ::operator=((tuple<TokenStream::TokenData_const*&,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>&>
               *)&rule_result,&local_1c8);
  eggs::variants::detail::
  _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
  ::~_storage(&local_1c8.second._storage);
  pPVar11 = local_290;
  if (it != end) {
    if (it->type != NewLine) {
      __assert_fail("it->type == Token::NewLine",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/src/parser_syntax.cpp"
                    ,0x36b,
                    "ParserResult parse_variable_declaration(ParserContext &, token_iterator, token_iterator)"
                   );
    }
    it = it + 1;
  }
  bVar6 = is<ParserSuccess,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>>
                    (&idents);
  if (bVar6) {
    pPVar8 = eggs::variants::
             get<ParserSuccess,ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>,0ul>
                       (&idents);
    peVar2 = (pPVar8->tree).super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (*(pointer *)
         ((long)&(peVar2->childs).
                 super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
                 ._M_impl.super__Vector_impl_data + 8) !=
        (peVar2->childs).
        super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
        ._M_impl.super__Vector_impl_data._M_start) goto LAB_001bd6c5;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,"expected identifier after this token",
               (allocator<char> *)&local_1c8);
    e.error._M_dataplus._M_p = (pointer)&e.error.field_2;
    e.state = Error;
    e.context = local_298;
    if (local_278._M_ptr == (element_type *)local_268) {
      e.error.field_2._8_8_ = local_268._8_8_;
    }
    else {
      e.error._M_dataplus._M_p = (pointer)local_278._M_ptr;
    }
    e.error._M_string_length = (size_type)local_278._M_refcount._M_pi;
    local_278._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_268[0] = 0;
    local_278._M_ptr = (element_type *)local_268;
    std::__cxx11::string::~string((string *)&local_278);
    ParserError::ParserError((ParserError *)local_1f8,&e);
    IL._M_len = 1;
    IL._M_array = (ParserError *)local_1f8;
    llvm_vecsmall::SmallVector<ParserError,_1U>::SmallVector
              ((SmallVector<ParserError,_1U> *)&local_1c8,IL);
    eggs::variants::detail::
    _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>,true,true>
    ::_storage<2ul,llvm_vecsmall::SmallVector<ParserError,1u>>
              ((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>,true,true>
                *)&rule_result,&local_1c8);
    llvm_vecsmall::SmallVectorImpl<ParserError>::~SmallVectorImpl
              ((SmallVectorImpl<ParserError> *)&local_1c8);
    std::__cxx11::string::~string(local_1e8);
    std::__cxx11::string::~string((string *)&e.error);
    pPVar11->first = it;
    eggs::variants::detail::
    _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
    ::_storage((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                *)&pPVar11->second,
               (_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                *)&rule_result);
    ppVar10 = &rule_result;
LAB_001bd909:
    eggs::variants::detail::
    _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
    ::~_storage((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
                 *)ppVar10);
  }
  else {
LAB_001bd6c5:
    bVar6 = is<ParserSuccess,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>>
                      (&idents);
    if (!bVar6) {
      eggs::variants::detail::
      _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
      ::_storage((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                  *)&local_88,
                 (_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                  *)&idents);
      giveup_to_expected((ParserState *)&rule_result,&local_88,"identifier");
      pPVar11->first = it;
      eggs::variants::detail::
      _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
      ::_storage((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                  *)&pPVar11->second,
                 (_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                  *)&rule_result);
      eggs::variants::detail::
      _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
      ::~_storage((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
                   *)&rule_result);
      ppVar10 = (pair<const_TokenStream::TokenData_*,_eggs::variants::variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>_>
                 *)&local_88;
      goto LAB_001bd909;
    }
    pSVar9 = (SyntaxTree *)operator_new(0x88);
    SyntaxTree::SyntaxTree(pSVar9,(NodeType)local_288,&parser->instream,local_298);
    std::__shared_ptr<SyntaxTree,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<SyntaxTree,void>
              ((__shared_ptr<SyntaxTree,(__gnu_cxx::_Lock_policy)2> *)&local_1c8,pSVar9);
    pTVar5 = local_1c8.first;
    other = &eggs::variants::
             get<ParserSuccess,ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>,0ul>
                       (&idents)->tree;
    SyntaxTree::take_childs((SyntaxTree *)pTVar5,other);
    uVar3 = local_1c8.second._storage.
            super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
            .
            super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
            .
            super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
            .field_0._0_8_;
    pTVar5 = local_1c8.first;
    local_98 = 0;
    _Stack_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    rule_result.first = it;
    e.state = GiveUp;
    e._4_4_ = 0;
    e.context = (token_iterator)0x0;
    rule_result.second._storage.
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
    .
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
    .
    super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
    .field_0._8_8_ = 0;
    pPVar11->first = it;
    local_1c8.first = (TokenData *)0x0;
    local_1c8.second._storage.
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
    .
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
    .
    super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
    .field_0._0_8_ = (SyntaxTree *)0x0;
    *(TokenData **)
     &(pPVar11->second)._storage.
      super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
      .
      super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
      .
      super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
      .field_0 = pTVar5;
    *(undefined8 *)
     ((long)&(pPVar11->second)._storage.
             super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
             .
             super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
             .
             super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
             .field_0 + 8) = uVar3;
    rule_result.second._storage.
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
    .
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
    .
    super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
    .field_0._0_8_ = 0;
    (pPVar11->second)._storage.
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
    .
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
    ._which = 1;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&rule_result.second._storage.
                       super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                       .
                       super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
                       .
                       super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
                       .field_0 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&e.context);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_90);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1c8.second);
  }
  ppVar10 = (pair<const_TokenStream::TokenData_*,_eggs::variants::variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>_>
             *)&idents;
LAB_001bd916:
  eggs::variants::detail::
  _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
  ::~_storage((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
               *)ppVar10);
  return pPVar11;
}

Assistant:

static ParserResult parse_variable_declaration(ParserContext& parser, token_iterator begin, token_iterator end)
{
    if(begin != end)
    {
        NodeType type = begin->type == Token::VAR_INT? NodeType::VAR_INT :
                        begin->type == Token::LVAR_INT? NodeType::LVAR_INT :
                        begin->type == Token::VAR_FLOAT? NodeType::VAR_FLOAT :
                        begin->type == Token::LVAR_FLOAT? NodeType::LVAR_FLOAT :
                        begin->type == Token::VAR_TEXT_LABEL? NodeType::VAR_TEXT_LABEL :
                        begin->type == Token::LVAR_TEXT_LABEL? NodeType::LVAR_TEXT_LABEL :
                        begin->type == Token::VAR_TEXT_LABEL16? NodeType::VAR_TEXT_LABEL16 :
                        begin->type == Token::LVAR_TEXT_LABEL16? NodeType::LVAR_TEXT_LABEL16 :
                                                                   NodeType::Block;

        if(type != NodeType::Block)
        {
            auto it = std::next(begin);
            ParserState idents;

            std::tie(it, idents) = parse_until_if(parse_identifier, parser, it, end, [](token_iterator t) {
                return t->type == Token::NewLine;
            });

            if(it != end)
            {
                assert(it->type == Token::NewLine);
                ++it;
            }

            if(is<ParserSuccess>(idents) && get<ParserSuccess>(idents).tree->child_count() == 0)
            {
                return std::make_pair(it, make_error(ParserStatus::Error, begin, "expected identifier after this token"));
            }

            if(is<ParserSuccess>(idents))
            {
                shared_ptr<SyntaxTree> tree(new SyntaxTree(type, parser.instream, *begin));
                tree->take_childs(get<ParserSuccess>(idents).tree);
                return std::make_pair(it, ParserSuccess(std::move(tree)));
            }
            else
            {
                return std::make_pair(it, giveup_to_expected(std::move(idents), "identifier"));
            }
        }
    }
    return std::make_pair(end, make_error(ParserStatus::GiveUp, begin));
}